

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn.c
# Opt level: O1

int Dau_PrintStats(int nNodes,int nInputs,int nVars,Vec_Int_t *vNodSup,int iStart,int iStop,
                  word nSteps,int Count2,abctime clk)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  int level;
  timespec local_40;
  
  printf("N =%2d | ",nNodes);
  printf("C =%12.0f  ",(double)(long)nSteps);
  printf("New%d =%10d  ",(ulong)(uint)nInputs,(ulong)(uint)(iStop - iStart));
  printf("All%d =%10d | ",(ulong)(uint)nInputs,(ulong)(uint)iStop);
  uVar1 = Dau_CountFuncs(vNodSup,iStart,iStop,nVars);
  printf("New%d =%8d  ",(ulong)(uint)nVars,(ulong)uVar1);
  uVar2 = Dau_CountFuncs(vNodSup,0,iStop,nVars);
  printf("All%d =%8d  ",(ulong)(uint)nVars,(ulong)uVar2);
  printf("Two =%6d ",(ulong)(uint)Count2);
  level = 3;
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(level,"%9.2f sec\n",(double)(lVar4 - clk) / 1000000.0);
  fflush(_stdout);
  return uVar1;
}

Assistant:

int Dau_PrintStats( int nNodes, int nInputs, int nVars, Vec_Int_t * vNodSup, int iStart, int iStop, word nSteps, int Count2, abctime clk )
{
    int nNew;
    printf("N =%2d | ",      nNodes );
    printf("C =%12.0f  ",    (double)(iword)nSteps );
    printf("New%d =%10d  ",  nInputs, iStop-iStart );
    printf("All%d =%10d | ", nInputs, iStop );
    printf("New%d =%8d  ",   nVars, nNew = Dau_CountFuncs(vNodSup, iStart, iStop, nVars) );
    printf("All%d =%8d  ",   nVars,        Dau_CountFuncs(vNodSup,      0, iStop, nVars) );
    printf("Two =%6d ",      Count2 );
    //Abc_PrintTime( 1, "T",   Abc_Clock() - clk );
    Abc_Print(1, "%9.2f sec\n", 1.0*(Abc_Clock() - clk)/(CLOCKS_PER_SEC));
    fflush(stdout);
    return nNew;
}